

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

int64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_sint64
                  (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  bool bVar1;
  int64_t ret;
  int64_t default_val;
  upb_MiniTableField field;
  int64_t local_28;
  int64_t local_20;
  upb_MiniTableField local_18;
  
  local_20 = 0;
  local_18.number_dont_copy_me__upb_internal_use_only = 6;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x118;
  local_18.presence = 0x45;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x12';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc2;
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,&local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,&local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28;
}

Assistant:

UPB_INLINE int64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_sint64(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  int64_t default_val = (int64_t)0ll;
  int64_t ret;
  const upb_MiniTableField field = {6, UPB_SIZE(520, 280), 69, kUpb_NoSub, 18, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_8Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}